

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

Oop __thiscall Lodtalk::Class::getBinding(Class *this,VMContext *context)

{
  anon_union_8_4_0eb573b0_for_Oop_0 aVar1;
  
  aVar1.pointer = (uint8_t *)VMContext::getGlobalFromSymbol(context,(this->name).field_0);
  if (aVar1.pointer == (uint8_t *)&NilObject) {
    aVar1.header = VMContext::newObject(context,2,0,OF_FIXED_SIZE,0x28,-1);
    *(undefined8 **)(aVar1.uintValue + 8) = &NilObject;
    *(Class **)(aVar1.uintValue + 0x10) = this;
  }
  return (Oop)aVar1.pointer;
}

Assistant:

Oop Class::getBinding(VMContext *context)
{
	// Find myself in the global dictionary
	auto result = context->getGlobalFromSymbol(name);
	if(!isNil(result))
		return result;

	// TODO: Find an existing
	return Oop::fromPointer(Association::make(context, nilOop(), selfOop()));
}